

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

cupdlp_retcode
PDHG_PostSolve(CUPDLPwork *pdhg,cupdlp_int nCols_origin,cupdlp_int *constraint_new_idx,
              cupdlp_int *constraint_type,cupdlp_float *col_value,cupdlp_float *col_dual,
              cupdlp_float *row_value,cupdlp_float *row_dual,cupdlp_int *value_valid,
              cupdlp_int *dual_valid)

{
  cupdlp_float weight;
  int iVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  void *__dest;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  void *in_R8;
  cupdlp_float *in_R9;
  void *in_stack_00000008;
  cupdlp_float *in_stack_00000010;
  uint *in_stack_00000018;
  uint *in_stack_00000020;
  int i_4;
  int i_3;
  int i_2;
  int j;
  int i_1;
  int i;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  cupdlp_float *col_buffer2;
  cupdlp_float *row_buffer;
  cupdlp_float *col_buffer;
  cupdlp_int row_dual_flag;
  cupdlp_int row_value_flag;
  cupdlp_int col_dual_flag;
  cupdlp_int col_value_flag;
  cupdlp_float sense;
  CUPDLPresobj *resobj;
  CUPDLPscaling *scaling;
  CUPDLPiterates *iterates;
  CUPDLPproblem *problem;
  cupdlp_retcode retcode;
  cupdlp_float *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  void *local_88;
  void *local_80;
  cupdlp_retcode local_34;
  
  local_34 = 0;
  lVar2 = *in_RDI;
  lVar3 = in_RDI[3];
  piVar4 = (int *)in_RDI[5];
  lVar5 = in_RDI[2];
  weight = *(cupdlp_float *)(lVar2 + 0x68);
  bVar9 = false;
  bVar8 = false;
  bVar10 = false;
  local_80 = (void *)0x0;
  local_88 = (void *)0x0;
  __dest = malloc((long)*(int *)(lVar2 + 0x44) << 3);
  if (__dest == (void *)0x0) {
    local_34 = 1;
  }
  else {
    local_80 = malloc((long)*(int *)(lVar2 + 0x40) << 3);
    if (local_80 == (void *)0x0) {
      local_34 = 1;
    }
    else {
      local_88 = malloc((long)*(int *)(lVar2 + 0x44) << 3);
      if (local_88 == (void *)0x0) {
        local_34 = 1;
      }
      else {
        iVar1 = *(int *)in_RDI[6];
        lVar6 = *(long *)(lVar3 + 0x40 + (long)(iVar1 % 2) * 8);
        lVar7 = *(long *)(lVar3 + 0x50 + (long)(iVar1 % 2) * 8);
        lVar3 = *(long *)(lVar3 + 0x60 + (long)(iVar1 % 2) * 8);
        if (*piVar4 != 0) {
          cupdlp_ediv((cupdlp_float *)
                      CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                      in_stack_ffffffffffffff08,0);
          cupdlp_ediv((cupdlp_float *)
                      CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                      in_stack_ffffffffffffff08,0);
          cupdlp_edot((cupdlp_float *)
                      CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                      in_stack_ffffffffffffff08,0);
          cupdlp_edot((cupdlp_float *)
                      CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                      in_stack_ffffffffffffff08,0);
          cupdlp_edot((cupdlp_float *)
                      CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                      in_stack_ffffffffffffff08,0);
          cupdlp_edot((cupdlp_float *)
                      CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                      in_stack_ffffffffffffff08,0);
        }
        if (in_R8 != (void *)0x0) {
          memcpy(in_R8,*(void **)(lVar6 + 8),(long)in_ESI << 3);
        }
        if (in_stack_00000008 != (void *)0x0) {
          if (in_RDX == 0) {
            memcpy(in_stack_00000008,*(void **)(lVar3 + 8),(long)*(int *)(lVar2 + 0x40) << 3);
          }
          else {
            memcpy(local_80,*(void **)(lVar3 + 8),(long)*(int *)(lVar2 + 0x40) << 3);
            for (local_b4 = 0; local_b4 < *(int *)(lVar2 + 0x40); local_b4 = local_b4 + 1) {
              *(undefined8 *)((long)in_stack_00000008 + (long)local_b4 * 8) =
                   *(undefined8 *)((long)local_80 + (long)*(int *)(in_RDX + (long)local_b4 * 4) * 8)
              ;
            }
          }
          if (in_RCX != 0) {
            memcpy(__dest,*(void **)(lVar6 + 8),(long)*(int *)(lVar2 + 0x44) << 3);
            local_bc = 0;
            for (local_b8 = 0; local_b8 < *(int *)(lVar2 + 0x40); local_b8 = local_b8 + 1) {
              if (*(int *)(in_RCX + (long)local_b8 * 4) == 1) {
                *(ulong *)((long)in_stack_00000008 + (long)local_b8 * 8) =
                     *(ulong *)((long)in_stack_00000008 + (long)local_b8 * 8) ^ 0x8000000000000000;
              }
              else if (*(int *)(in_RCX + (long)local_b8 * 4) == 3) {
                *(double *)((long)in_stack_00000008 + (long)local_b8 * 8) =
                     *(double *)((long)in_stack_00000008 + (long)local_b8 * 8) +
                     *(double *)((long)__dest + (long)(in_ESI + local_bc) * 8);
                local_bc = local_bc + 1;
              }
            }
          }
          bVar8 = true;
        }
        if (in_R9 != (cupdlp_float *)0x0) {
          memcpy(__dest,*(void **)(lVar5 + 0x50),(long)in_ESI << 3);
          memcpy(local_88,*(void **)(lVar5 + 0x58),(long)in_ESI << 3);
          for (local_c0 = 0; local_c0 < in_ESI; local_c0 = local_c0 + 1) {
            in_R9[local_c0] =
                 *(double *)((long)__dest + (long)local_c0 * 8) -
                 *(double *)((long)local_88 + (long)local_c0 * 8);
          }
          ScaleVector(weight,in_R9,in_ESI);
          bVar9 = true;
        }
        if (in_stack_00000010 != (cupdlp_float *)0x0) {
          if (in_RDX == 0) {
            memcpy(in_stack_00000010,*(void **)(lVar7 + 8),(long)*(int *)(lVar2 + 0x40) << 3);
          }
          else {
            memcpy(local_80,*(void **)(lVar7 + 8),(long)*(int *)(lVar2 + 0x40) << 3);
            for (local_c4 = 0; local_c4 < *(int *)(lVar2 + 0x40); local_c4 = local_c4 + 1) {
              in_stack_00000010[local_c4] =
                   *(cupdlp_float *)
                    ((long)local_80 + (long)*(int *)(in_RDX + (long)local_c4 * 4) * 8);
            }
          }
          ScaleVector(weight,in_stack_00000010,*(cupdlp_int *)(lVar2 + 0x40));
          if (in_RCX != 0) {
            for (local_c8 = 0; local_c8 < *(int *)(lVar2 + 0x40); local_c8 = local_c8 + 1) {
              if (*(int *)(in_RCX + (long)local_c8 * 4) == 1) {
                in_stack_00000010[local_c8] = -in_stack_00000010[local_c8];
              }
            }
          }
          bVar10 = true;
        }
        if (in_stack_00000018 != (uint *)0x0) {
          *in_stack_00000018 = (uint)(in_R8 != (void *)0x0 && bVar8);
        }
        if (in_stack_00000020 != (uint *)0x0) {
          *in_stack_00000020 = (uint)(bVar9 && bVar10);
        }
      }
    }
  }
  free(__dest);
  free(local_80);
  free(local_88);
  return local_34;
}

Assistant:

cupdlp_retcode PDHG_PostSolve(CUPDLPwork *pdhg, cupdlp_int nCols_origin,
                              cupdlp_int *constraint_new_idx,
                              cupdlp_int *constraint_type,
                              cupdlp_float *col_value, cupdlp_float *col_dual,
                              cupdlp_float *row_value, cupdlp_float *row_dual,
                              cupdlp_int *value_valid, cupdlp_int *dual_valid) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPscaling *scaling = pdhg->scaling;
  CUPDLPresobj *resobj = pdhg->resobj;
  cupdlp_float sense = problem->sense_origin;

  // flag
  cupdlp_int col_value_flag = 0;
  cupdlp_int col_dual_flag = 0;
  cupdlp_int row_value_flag = 0;
  cupdlp_int row_dual_flag = 0;

  // allocate buffer
  cupdlp_float *col_buffer = NULL;
  cupdlp_float *row_buffer = NULL;
  cupdlp_float *col_buffer2 = NULL;
  // no need for row_buffer2
  // cupdlp_float *row_buffer2 = NULL;
  CUPDLP_INIT_DOUBLE(col_buffer, problem->nCols);
  CUPDLP_INIT_DOUBLE(row_buffer, problem->nRows);
  CUPDLP_INIT_DOUBLE(col_buffer2, problem->nCols);
  // CUPDLP_INIT_DOUBLE(row_buffer2, problem->nRows);

  
  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  // unscale
  if (scaling->ifScaled) {
    cupdlp_ediv(x->data, pdhg->colScale, problem->nCols);
    cupdlp_ediv(y->data, pdhg->rowScale, problem->nRows);
    cupdlp_edot(resobj->dSlackPos, pdhg->colScale, problem->nCols);
    cupdlp_edot(resobj->dSlackNeg, pdhg->colScale, problem->nCols);
    cupdlp_edot(ax->data, pdhg->rowScale, problem->nRows);
    cupdlp_edot(aty->data, pdhg->colScale, problem->nCols);
  }

  // col value: extract x from (x, z)
  if (col_value) {
    CUPDLP_COPY_VEC(col_value, x->data, cupdlp_float, nCols_origin);

    col_value_flag = 1;
  }

  // row value
  if (row_value) {
    if (constraint_new_idx) {
      CUPDLP_COPY_VEC(row_buffer, ax->data, cupdlp_float,
                      problem->nRows);

      // un-permute row value
      for (int i = 0; i < problem->nRows; i++) {
        row_value[i] = row_buffer[constraint_new_idx[i]];
      }
    } else {
      CUPDLP_COPY_VEC(row_value, ax->data, cupdlp_float,
                      problem->nRows);
    }

    if (constraint_type) {
      CUPDLP_COPY_VEC(col_buffer, x->data, cupdlp_float,
                      problem->nCols);

      // EQ = 0, LEQ = 1, GEQ = 2, BOUND = 3
      for (int i = 0, j = 0; i < problem->nRows; i++) {
        if (constraint_type[i] == 1) {  // LEQ: multiply -1
          row_value[i] = -row_value[i];
        } else if (constraint_type[i] == 3) {  // BOUND: get Ax from Ax - z
          row_value[i] = row_value[i] + col_buffer[nCols_origin + j];
          j++;
        }
      }
    }

    row_value_flag = 1;
  }

  // col duals of l <= x <= u
  if (col_dual) {
    CUPDLP_COPY_VEC(col_buffer, resobj->dSlackPos, cupdlp_float, nCols_origin);
    CUPDLP_COPY_VEC(col_buffer2, resobj->dSlackNeg, cupdlp_float, nCols_origin);

    for (int i = 0; i < nCols_origin; i++) {
      col_dual[i] = col_buffer[i] - col_buffer2[i];
    }

    ScaleVector(sense, col_dual, nCols_origin);

    col_dual_flag = 1;
  }

  // row dual: recover y
  if (row_dual) {
    if (constraint_new_idx) {
      CUPDLP_COPY_VEC(row_buffer, y->data, cupdlp_float,
                      problem->nRows);
      // un-permute row dual
      for (int i = 0; i < problem->nRows; i++) {
        row_dual[i] = row_buffer[constraint_new_idx[i]];
      }
    } else {
      CUPDLP_COPY_VEC(row_dual, y->data, cupdlp_float,
                      problem->nRows);
    }

    ScaleVector(sense, row_dual, problem->nRows);

    if (constraint_type) {
      // EQ = 0, LEQ = 1, GEQ = 2, BOUND = 3
      for (int i = 0; i < problem->nRows; i++) {
        if (constraint_type[i] == 1) {  // LEQ: multiply -1
          row_dual[i] = -row_dual[i];
        }
      }
    }

    row_dual_flag = 1;
  }

  // valid
  if (value_valid) {
    *value_valid = col_value_flag && row_value_flag;
  }

  if (dual_valid) {
    *dual_valid = col_dual_flag && row_dual_flag;
  }

exit_cleanup:
  // free buffer
  CUPDLP_FREE(col_buffer);
  CUPDLP_FREE(row_buffer);
  CUPDLP_FREE(col_buffer2);
  // CUPDLP_FREE(row_buffer2);

  return retcode;
}